

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestTestHandler::SetTestsProperties
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmListFileBacktrace *value;
  cmCTest *this_00;
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  uint uVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  mapped_type *pmVar7;
  ostream *poVar8;
  string *__lhs;
  string *psVar9;
  ulong uVar10;
  pointer pbVar11;
  cmState *pcVar12;
  pointer __rhs;
  string *cr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  string_view value_00;
  string_view value_01;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view value_02;
  string_view arg_03;
  string_view arg_04;
  string_view value_03;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view arg_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  string_view arg_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  basic_string_view<char,_std::char_traits<char>_> __y_12;
  basic_string_view<char,_std::char_traits<char>_> __y_13;
  basic_string_view<char,_std::char_traits<char>_> __y_14;
  basic_string_view<char,_std::char_traits<char>_> __y_15;
  basic_string_view<char,_std::char_traits<char>_> __y_16;
  basic_string_view<char,_std::char_traits<char>_> __y_17;
  basic_string_view<char,_std::char_traits<char>_> __y_18;
  basic_string_view<char,_std::char_traits<char>_> __y_19;
  basic_string_view<char,_std::char_traits<char>_> __y_20;
  basic_string_view<char,_std::char_traits<char>_> __y_21;
  basic_string_view<char,_std::char_traits<char>_> __y_22;
  basic_string_view<char,_std::char_traits<char>_> __y_23;
  basic_string_view<char,_std::char_traits<char>_> __y_24;
  basic_string_view<char,_std::char_traits<char>_> __y_25;
  long lStack_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  triples;
  long line;
  cmCTestTestHandler *local_430;
  pointer local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  pointer local_410;
  cmListFileContext fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_378;
  cmState state;
  cmListFileContext local_a0;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  
  tests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_430 = this;
  do {
    if (__lhs == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
LAB_001aacc9:
      bVar3 = false;
LAB_001aaccc:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests);
      return bVar3;
    }
    bVar3 = std::operator==(__lhs,"PROPERTIES");
    if (bVar3) {
      local_428 = (pointer)args;
LAB_001aa1cd:
      psVar9 = __lhs;
      bVar3 = true;
      if ((psVar9 + 1 != (string *)local_428->_M_string_length) &&
         (__lhs = psVar9 + 2, __lhs != (string *)local_428->_M_string_length)) {
        local_420 = tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pbVar11 = tests.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
LAB_001aa20d:
        if (pbVar11 != local_420) {
          __rhs = (local_430->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          local_410 = (local_430->TestList).
                      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_418 = pbVar11;
LAB_001aa235:
          if (__rhs == local_410) break;
          _Var4 = std::operator==(local_418,&__rhs->Name);
          if (_Var4) {
            __x._M_str = psVar9[1]._M_dataplus._M_p;
            __x._M_len = psVar9[1]._M_string_length;
            __y._M_str = "_BACKTRACE_TRIPLES";
            __y._M_len = 0x12;
            bVar3 = std::operator==(__x,__y);
            if (bVar3) {
              triples.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              triples.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              triples.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              arg_09._M_str = psVar9[2]._M_dataplus._M_p;
              arg_09._M_len = psVar9[2]._M_string_length;
              cmExpandList(arg_09,&triples,true);
              if ((ulong)((long)triples.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)triples.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) % 3 == 0) {
                cmState::cmState(&state,Unknown,Normal);
                fc.Name._M_dataplus._M_p = (pointer)0x0;
                fc.Name._M_string_length = 0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                          ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&fc);
                value = &__rhs->Backtrace;
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             *)value,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      *)&fc);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fc.Name._M_string_length);
                lVar14 = ((long)triples.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)triples.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) + -0x20;
                for (uVar10 = (long)triples.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)triples.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5; 2 < uVar10;
                    uVar10 = uVar10 - 3) {
                  fc.Name._M_dataplus._M_p = (pointer)&fc.Name.field_2;
                  fc.Name._M_string_length = 0;
                  fc.Name.field_2._M_local_buf[0] = '\0';
                  fc.FilePath._M_dataplus._M_p = (pointer)&fc.FilePath.field_2;
                  fc.FilePath._M_string_length = 0;
                  fc.FilePath.field_2._M_local_buf[0] = '\0';
                  fc.Line = 0;
                  fc.DeferId.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged = false;
                  std::__cxx11::string::_M_assign((string *)&fc.FilePath);
                  line = 0;
                  bVar3 = cmStrToLong((string *)
                                      ((long)&triples.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              _M_dataplus._M_p + lVar14),&line);
                  if (!bVar3) {
                    line = 0;
                  }
                  fc.Line = line;
                  std::__cxx11::string::_M_assign((string *)&fc);
                  cmListFileContext::cmListFileContext(&local_a0,&fc);
                  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_378,
                             (cmListFileContext *)value);
                  std::
                  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               *)value,&local_378);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_378._M_refcount);
                  cmListFileContext::~cmListFileContext(&local_a0);
                  cmListFileContext::~cmListFileContext(&fc);
                  lVar14 = lVar14 + -0x60;
                }
                cmState::~cmState(&state);
              }
              pcVar12 = (cmState *)&triples;
LAB_001aa498:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pcVar12);
            }
            else {
              __x_00._M_str = psVar9[1]._M_dataplus._M_p;
              __x_00._M_len = psVar9[1]._M_string_length;
              __y_00._M_str = "WILL_FAIL";
              __y_00._M_len = 9;
              bVar3 = std::operator==(__x_00,__y_00);
              if (bVar3) {
                value_00._M_str = extraout_RDX;
                value_00._M_len = (size_t)psVar9[2]._M_dataplus._M_p;
                bVar3 = cmValue::IsOn((cmValue *)psVar9[2]._M_string_length,value_00);
                __rhs->WillFail = bVar3;
              }
              else {
                __x_01._M_str = psVar9[1]._M_dataplus._M_p;
                __x_01._M_len = psVar9[1]._M_string_length;
                __y_01._M_str = "DISABLED";
                __y_01._M_len = 8;
                bVar3 = std::operator==(__x_01,__y_01);
                if (bVar3) {
                  value_01._M_str = extraout_RDX_00;
                  value_01._M_len = (size_t)psVar9[2]._M_dataplus._M_p;
                  bVar3 = cmValue::IsOn((cmValue *)psVar9[2]._M_string_length,value_01);
                  __rhs->Disabled = bVar3;
                }
                else {
                  __x_02._M_str = psVar9[1]._M_dataplus._M_p;
                  __x_02._M_len = psVar9[1]._M_string_length;
                  __y_02._M_str = "ATTACHED_FILES";
                  __y_02._M_len = 0xe;
                  bVar3 = std::operator==(__x_02,__y_02);
                  lStack_470 = 0x88;
                  if (!bVar3) {
                    __x_03._M_str = psVar9[1]._M_dataplus._M_p;
                    __x_03._M_len = psVar9[1]._M_string_length;
                    __y_03._M_str = "ATTACHED_FILES_ON_FAIL";
                    __y_03._M_len = 0x16;
                    bVar3 = std::operator==(__x_03,__y_03);
                    lStack_470 = 0xa0;
                    if (!bVar3) {
                      __x_04._M_str = psVar9[1]._M_dataplus._M_p;
                      __x_04._M_len = psVar9[1]._M_string_length;
                      __y_04._M_str = "RESOURCE_LOCK";
                      __y_04._M_len = 0xd;
                      bVar3 = std::operator==(__x_04,__y_04);
                      if (bVar3) {
                        arg._M_str = psVar9[2]._M_dataplus._M_p;
                        arg._M_len = psVar9[2]._M_string_length;
                        cmExpandedList_abi_cxx11_
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&state,arg,false);
                        std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::
                        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&__rhs->LockedResources,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )state.PropertyDefinitions.Map_._M_t._M_impl._0_8_,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )state.PropertyDefinitions.Map_._M_t._M_impl.
                                     super__Rb_tree_header._M_header._0_8_);
                      }
                      else {
                        __x_05._M_str = psVar9[1]._M_dataplus._M_p;
                        __x_05._M_len = psVar9[1]._M_string_length;
                        __y_05._M_str = "FIXTURES_SETUP";
                        __y_05._M_len = 0xe;
                        bVar3 = std::operator==(__x_05,__y_05);
                        if (bVar3) {
                          arg_00._M_str = psVar9[2]._M_dataplus._M_p;
                          arg_00._M_len = psVar9[2]._M_string_length;
                          cmExpandedList_abi_cxx11_
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&state,arg_00,false);
                          std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::
                          _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&__rhs->FixturesSetup,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )state.PropertyDefinitions.Map_._M_t._M_impl._0_8_,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )state.PropertyDefinitions.Map_._M_t._M_impl.
                                       super__Rb_tree_header._M_header._0_8_);
                        }
                        else {
                          __x_06._M_str = psVar9[1]._M_dataplus._M_p;
                          __x_06._M_len = psVar9[1]._M_string_length;
                          __y_06._M_str = "FIXTURES_CLEANUP";
                          __y_06._M_len = 0x10;
                          bVar3 = std::operator==(__x_06,__y_06);
                          if (bVar3) {
                            arg_01._M_str = psVar9[2]._M_dataplus._M_p;
                            arg_01._M_len = psVar9[2]._M_string_length;
                            cmExpandedList_abi_cxx11_
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&state,arg_01,false);
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::
                            _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&__rhs->FixturesCleanup,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )state.PropertyDefinitions.Map_._M_t._M_impl._0_8_,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )state.PropertyDefinitions.Map_._M_t._M_impl.
                                         super__Rb_tree_header._M_header._0_8_);
                          }
                          else {
                            __x_07._M_str = psVar9[1]._M_dataplus._M_p;
                            __x_07._M_len = psVar9[1]._M_string_length;
                            __y_07._M_str = "FIXTURES_REQUIRED";
                            __y_07._M_len = 0x11;
                            bVar3 = std::operator==(__x_07,__y_07);
                            if (!bVar3) {
                              __x_08._M_str = psVar9[1]._M_dataplus._M_p;
                              __x_08._M_len = psVar9[1]._M_string_length;
                              __y_08._M_str = "TIMEOUT";
                              __y_08._M_len = 7;
                              bVar3 = std::operator==(__x_08,__y_08);
                              if (bVar3) {
                                dVar1 = atof((__lhs->_M_dataplus)._M_p);
                                (__rhs->Timeout).__r = dVar1;
                                __rhs->ExplicitTimeout = true;
                              }
                              else {
                                __x_09._M_str = psVar9[1]._M_dataplus._M_p;
                                __x_09._M_len = psVar9[1]._M_string_length;
                                __y_09._M_str = "COST";
                                __y_09._M_len = 4;
                                bVar3 = std::operator==(__x_09,__y_09);
                                if (bVar3) {
                                  dVar1 = atof((__lhs->_M_dataplus)._M_p);
                                  __rhs->Cost = (float)dVar1;
                                  goto LAB_001aa49d;
                                }
                                __x_10._M_str = psVar9[1]._M_dataplus._M_p;
                                __x_10._M_len = psVar9[1]._M_string_length;
                                __y_10._M_str = "REQUIRED_FILES";
                                __y_10._M_len = 0xe;
                                bVar3 = std::operator==(__x_10,__y_10);
                                lStack_470 = 0x58;
                                if (bVar3) goto LAB_001aa4ee;
                                __x_11._M_str = psVar9[1]._M_dataplus._M_p;
                                __x_11._M_len = psVar9[1]._M_string_length;
                                __y_11._M_str = "RUN_SERIAL";
                                __y_11._M_len = 10;
                                bVar3 = std::operator==(__x_11,__y_11);
                                if (bVar3) {
                                  value_02._M_str = extraout_RDX_01;
                                  value_02._M_len = (size_t)psVar9[2]._M_dataplus._M_p;
                                  bVar3 = cmValue::IsOn((cmValue *)psVar9[2]._M_string_length,
                                                        value_02);
                                  __rhs->RunSerial = bVar3;
                                }
                                else {
                                  __x_12._M_str = psVar9[1]._M_dataplus._M_p;
                                  __x_12._M_len = psVar9[1]._M_string_length;
                                  __y_12._M_str = "FAIL_REGULAR_EXPRESSION";
                                  __y_12._M_len = 0x17;
                                  bVar3 = std::operator==(__x_12,__y_12);
                                  if (bVar3) {
                                    arg_03._M_str = psVar9[2]._M_dataplus._M_p;
                                    arg_03._M_len = psVar9[2]._M_string_length;
                                    cmExpandedList_abi_cxx11_
                                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&state,arg_03,false);
                                    uVar2 = state.PropertyDefinitions.Map_._M_t._M_impl.
                                            super__Rb_tree_header._M_header._0_8_;
                                    for (pbVar13 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)state.PropertyDefinitions.Map_._M_t._M_impl.
                                                    _0_8_;
                                        pbVar13 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)uVar2; pbVar13 = pbVar13 + 1) {
                                      std::
                                      vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                      ::
                                      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->ErrorRegularExpressions,pbVar13,pbVar13)
                                      ;
                                    }
                                    goto LAB_001aa64a;
                                  }
                                  __x_13._M_str = psVar9[1]._M_dataplus._M_p;
                                  __x_13._M_len = psVar9[1]._M_string_length;
                                  __y_13._M_str = "SKIP_REGULAR_EXPRESSION";
                                  __y_13._M_len = 0x17;
                                  bVar3 = std::operator==(__x_13,__y_13);
                                  if (bVar3) {
                                    arg_04._M_str = psVar9[2]._M_dataplus._M_p;
                                    arg_04._M_len = psVar9[2]._M_string_length;
                                    cmExpandedList_abi_cxx11_
                                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&state,arg_04,false);
                                    uVar2 = state.PropertyDefinitions.Map_._M_t._M_impl.
                                            super__Rb_tree_header._M_header._0_8_;
                                    for (pbVar13 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)state.PropertyDefinitions.Map_._M_t._M_impl.
                                                    _0_8_;
                                        pbVar13 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)uVar2; pbVar13 = pbVar13 + 1) {
                                      std::
                                      vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                      ::
                                      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->SkipRegularExpressions,pbVar13,pbVar13);
                                    }
                                    goto LAB_001aa64a;
                                  }
                                  __x_14._M_str = psVar9[1]._M_dataplus._M_p;
                                  __x_14._M_len = psVar9[1]._M_string_length;
                                  __y_14._M_str = "PROCESSORS";
                                  __y_14._M_len = 10;
                                  bVar3 = std::operator==(__x_14,__y_14);
                                  if (bVar3) {
                                    iVar5 = atoi((__lhs->_M_dataplus)._M_p);
                                    if (iVar5 < 2) {
                                      iVar5 = 1;
                                    }
                                    __rhs->Processors = iVar5;
                                  }
                                  else {
                                    __x_15._M_str = psVar9[1]._M_dataplus._M_p;
                                    __x_15._M_len = psVar9[1]._M_string_length;
                                    __y_15._M_str = "PROCESSOR_AFFINITY";
                                    __y_15._M_len = 0x12;
                                    bVar3 = std::operator==(__x_15,__y_15);
                                    if (bVar3) {
                                      value_03._M_str = extraout_RDX_02;
                                      value_03._M_len = (size_t)psVar9[2]._M_dataplus._M_p;
                                      bVar3 = cmValue::IsOn((cmValue *)psVar9[2]._M_string_length,
                                                            value_03);
                                      __rhs->WantAffinity = bVar3;
                                      goto LAB_001aa49d;
                                    }
                                    __x_16._M_str = psVar9[1]._M_dataplus._M_p;
                                    __x_16._M_len = psVar9[1]._M_string_length;
                                    __y_16._M_str = "RESOURCE_GROUPS";
                                    __y_16._M_len = 0xf;
                                    bVar3 = std::operator==(__x_16,__y_16);
                                    if (bVar3) {
                                      bVar3 = ParseResourceGroupsProperty
                                                        (__lhs,&__rhs->ResourceGroups);
                                      if (!bVar3) goto LAB_001aacc9;
                                    }
                                    else {
                                      __x_17._M_str = psVar9[1]._M_dataplus._M_p;
                                      __x_17._M_len = psVar9[1]._M_string_length;
                                      __y_17._M_str = "SKIP_RETURN_CODE";
                                      __y_17._M_len = 0x10;
                                      bVar3 = std::operator==(__x_17,__y_17);
                                      if (!bVar3) {
                                        __x_18._M_str = psVar9[1]._M_dataplus._M_p;
                                        __x_18._M_len = psVar9[1]._M_string_length;
                                        __y_18._M_str = "DEPENDS";
                                        __y_18._M_len = 7;
                                        bVar3 = std::operator==(__x_18,__y_18);
                                        lStack_470 = 0x70;
                                        if (!bVar3) {
                                          __x_19._M_str = psVar9[1]._M_dataplus._M_p;
                                          __x_19._M_len = psVar9[1]._M_string_length;
                                          __y_19._M_str = "ENVIRONMENT";
                                          __y_19._M_len = 0xb;
                                          bVar3 = std::operator==(__x_19,__y_19);
                                          lStack_470 = 0x1a0;
                                          if (!bVar3) {
                                            __x_20._M_str = psVar9[1]._M_dataplus._M_p;
                                            __x_20._M_len = psVar9[1]._M_string_length;
                                            __y_20._M_str = "ENVIRONMENT_MODIFICATION";
                                            __y_20._M_len = 0x18;
                                            bVar3 = std::operator==(__x_20,__y_20);
                                            lStack_470 = 0x1b8;
                                            if (!bVar3) {
                                              __x_21._M_str = psVar9[1]._M_dataplus._M_p;
                                              __x_21._M_len = psVar9[1]._M_string_length;
                                              __y_21._M_str = "LABELS";
                                              __y_21._M_len = 6;
                                              bVar3 = std::operator==(__x_21,__y_21);
                                              if (bVar3) {
                                                arg_05._M_str = psVar9[2]._M_dataplus._M_p;
                                                arg_05._M_len = psVar9[2]._M_string_length;
                                                cmExpandedList_abi_cxx11_
                                                          ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&state,arg_05,false);
                                                std::
                                                vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                ::
                                                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                                          ((
                                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                  *)&__rhs->Labels,
                                                  (__rhs->Labels).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )state.PropertyDefinitions.Map_._M_t._M_impl._0_8_
                                                  ,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )state.PropertyDefinitions.Map_._M_t._M_impl.
                                                   super__Rb_tree_header._M_header._0_8_);
                                                std::
                                                __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                                                          ((__rhs->Labels).
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (__rhs->Labels).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                __first = std::
                                                  __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                                            ((__rhs->Labels).
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (__rhs->Labels).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::erase(&__rhs->Labels,
                                                        (const_iterator)__first._M_current,
                                                        (__rhs->Labels).
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                goto LAB_001aa64a;
                                              }
                                              __x_22._M_str = psVar9[1]._M_dataplus._M_p;
                                              __x_22._M_len = psVar9[1]._M_string_length;
                                              __y_22._M_str = "MEASUREMENT";
                                              __y_22._M_len = 0xb;
                                              bVar3 = std::operator==(__x_22,__y_22);
                                              if (bVar3) {
                                                lVar14 = std::__cxx11::string::find
                                                                   ((char)__lhs,0x3d);
                                                if (lVar14 == -1) {
                                                  pmVar7 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&__rhs->Measurements,__lhs);
                                                  std::__cxx11::string::assign((char *)pmVar7);
                                                }
                                                else {
                                                  std::__cxx11::string::substr
                                                            ((ulong)&state,(ulong)__lhs);
                                                  std::__cxx11::string::substr
                                                            ((ulong)&fc,(ulong)__lhs);
                                                  pmVar7 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&__rhs->Measurements,
                                                               (key_type *)&state);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pmVar7,(string *)&fc);
                                                  std::__cxx11::string::~string((string *)&fc);
                                                  std::__cxx11::string::~string((string *)&state);
                                                }
                                              }
                                              else {
                                                __x_23._M_str = psVar9[1]._M_dataplus._M_p;
                                                __x_23._M_len = psVar9[1]._M_string_length;
                                                __y_23._M_str = "PASS_REGULAR_EXPRESSION";
                                                __y_23._M_len = 0x17;
                                                bVar3 = std::operator==(__x_23,__y_23);
                                                if (bVar3) {
                                                  arg_06._M_str = psVar9[2]._M_dataplus._M_p;
                                                  arg_06._M_len = psVar9[2]._M_string_length;
                                                  cmExpandedList_abi_cxx11_
                                                            ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&state,arg_06,false);
                                                  uVar2 = state.PropertyDefinitions.Map_._M_t.
                                                          _M_impl.super__Rb_tree_header._M_header.
                                                          _0_8_;
                                                  for (pbVar13 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)state.PropertyDefinitions.Map_._M_t._M_impl.
                                                    _0_8_; pbVar13 !=
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar2; pbVar13 = pbVar13 + 1) {
                                                    std::
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  ::
                                                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                            ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->RequiredRegularExpressions,pbVar13,
                                                  pbVar13);
                                                  }
                                                  pcVar12 = &state;
LAB_001aaca2:
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)pcVar12);
                                                }
                                                else {
                                                  __x_24._M_str = psVar9[1]._M_dataplus._M_p;
                                                  __x_24._M_len = psVar9[1]._M_string_length;
                                                  __y_24._M_str = "WORKING_DIRECTORY";
                                                  __y_24._M_len = 0x11;
                                                  bVar3 = std::operator==(__x_24,__y_24);
                                                  if (bVar3) {
                                                    std::__cxx11::string::_M_assign
                                                              ((string *)&__rhs->Directory);
                                                  }
                                                  else {
                                                    __x_25._M_str = psVar9[1]._M_dataplus._M_p;
                                                    __x_25._M_len = psVar9[1]._M_string_length;
                                                    __y_25._M_str = "TIMEOUT_AFTER_MATCH";
                                                    __y_25._M_len = 0x13;
                                                    bVar3 = std::operator==(__x_25,__y_25);
                                                    if (bVar3) {
                                                      arg_07._M_str = psVar9[2]._M_dataplus._M_p;
                                                      arg_07._M_len = psVar9[2]._M_string_length;
                                                      cmExpandedList_abi_cxx11_
                                                                (&triples,arg_07,false);
                                                      pbVar11 = triples.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if ((long)triples.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)triples.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0x40)
                                                  {
                                                    dVar1 = atof(((triples.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p);
                                                  (__rhs->AlternateTimeout).__r = dVar1;
                                                  arg_08._M_str = pbVar11[1]._M_dataplus._M_p;
                                                  arg_08._M_len = pbVar11[1]._M_string_length;
                                                  cmExpandedList_abi_cxx11_
                                                            ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&state,arg_08,false);
                                                  uVar2 = state.PropertyDefinitions.Map_._M_t.
                                                          _M_impl.super__Rb_tree_header._M_header.
                                                          _0_8_;
                                                  for (pbVar13 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)state.PropertyDefinitions.Map_._M_t._M_impl.
                                                    _0_8_; pbVar13 !=
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar2; pbVar13 = pbVar13 + 1) {
                                                    std::
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  ::
                                                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                            ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->TimeoutRegularExpressions,pbVar13,
                                                  pbVar13);
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&state);
                                                  }
                                                  else {
                                                    std::__cxx11::ostringstream::ostringstream
                                                              ((ostringstream *)&state);
                                                    poVar8 = std::operator<<((ostream *)&state,
                                                                                                                                                          
                                                  "TIMEOUT_AFTER_MATCH expects two arguments, found "
                                                  );
                                                  poVar8 = std::ostream::_M_insert<unsigned_long>
                                                                     ((ulong)poVar8);
                                                  std::endl<char,std::char_traits<char>>(poVar8);
                                                  this_00 = (local_430->super_cmCTestGenericHandler)
                                                            .CTest;
                                                  std::__cxx11::stringbuf::str();
                                                  cmCTest::Log(this_00,6,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                                  ,0x912,fc.Name._M_dataplus._M_p,false);
                                                  std::__cxx11::string::~string((string *)&fc);
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)&state);
                                                  }
                                                  pcVar12 = (cmState *)&triples;
                                                  goto LAB_001aaca2;
                                                  }
                                                  }
                                                }
                                              }
                                              goto LAB_001aa49d;
                                            }
                                          }
                                        }
                                        goto LAB_001aa4ee;
                                      }
                                      uVar6 = atoi((__lhs->_M_dataplus)._M_p);
                                      if (0xff < uVar6) {
                                        uVar6 = 0xffffffff;
                                      }
                                      __rhs->SkipReturnCode = uVar6;
                                    }
                                  }
                                }
                              }
                              goto LAB_001aa49d;
                            }
                            arg_02._M_str = psVar9[2]._M_dataplus._M_p;
                            arg_02._M_len = psVar9[2]._M_string_length;
                            cmExpandedList_abi_cxx11_
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&state,arg_02,false);
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::
                            _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&__rhs->FixturesRequired,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )state.PropertyDefinitions.Map_._M_t._M_impl._0_8_,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )state.PropertyDefinitions.Map_._M_t._M_impl.
                                         super__Rb_tree_header._M_header._0_8_);
                          }
                        }
                      }
LAB_001aa64a:
                      pcVar12 = &state;
                      goto LAB_001aa498;
                    }
                  }
LAB_001aa4ee:
                  arg_10._M_str = psVar9[2]._M_dataplus._M_p;
                  arg_10._M_len = psVar9[2]._M_string_length;
                  cmExpandList(arg_10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)((long)&(__rhs->Name)._M_dataplus._M_p + lStack_470),false)
                  ;
                }
              }
            }
          }
LAB_001aa49d:
          __rhs = __rhs + 1;
          goto LAB_001aa235;
        }
        goto LAB_001aa1cd;
      }
      goto LAB_001aaccc;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&tests,__lhs);
    __lhs = __lhs + 1;
  } while( true );
  pbVar11 = local_418 + 1;
  goto LAB_001aa20d;
}

Assistant:

bool cmCTestTestHandler::SetTestsProperties(
  const std::vector<std::string>& args)
{
  std::vector<std::string>::const_iterator it;
  std::vector<std::string> tests;
  bool found = false;
  for (it = args.begin(); it != args.end(); ++it) {
    if (*it == "PROPERTIES") {
      found = true;
      break;
    }
    tests.push_back(*it);
  }
  if (!found) {
    return false;
  }
  ++it; // skip PROPERTIES
  for (; it != args.end(); ++it) {
    std::string const& key = *it;
    ++it;
    if (it == args.end()) {
      break;
    }
    std::string const& val = *it;
    for (std::string const& t : tests) {
      for (cmCTestTestProperties& rt : this->TestList) {
        if (t == rt.Name) {
          if (key == "_BACKTRACE_TRIPLES"_s) {
            std::vector<std::string> triples;
            // allow empty args in the triples
            cmExpandList(val, triples, true);

            // Ensure we have complete triples otherwise the data is corrupt.
            if (triples.size() % 3 == 0) {
              cmState state(cmState::Unknown);
              rt.Backtrace = cmListFileBacktrace();

              // the first entry represents the top of the trace so we need to
              // reconstruct the backtrace in reverse
              for (size_t i = triples.size(); i >= 3; i -= 3) {
                cmListFileContext fc;
                fc.FilePath = triples[i - 3];
                long line = 0;
                if (!cmStrToLong(triples[i - 2], &line)) {
                  line = 0;
                }
                fc.Line = line;
                fc.Name = triples[i - 1];
                rt.Backtrace = rt.Backtrace.Push(fc);
              }
            }
          } else if (key == "WILL_FAIL"_s) {
            rt.WillFail = cmIsOn(val);
          } else if (key == "DISABLED"_s) {
            rt.Disabled = cmIsOn(val);
          } else if (key == "ATTACHED_FILES"_s) {
            cmExpandList(val, rt.AttachedFiles);
          } else if (key == "ATTACHED_FILES_ON_FAIL"_s) {
            cmExpandList(val, rt.AttachOnFail);
          } else if (key == "RESOURCE_LOCK"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.LockedResources.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_SETUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesSetup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_CLEANUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesCleanup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_REQUIRED"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesRequired.insert(lval.begin(), lval.end());
          } else if (key == "TIMEOUT"_s) {
            rt.Timeout = cmDuration(atof(val.c_str()));
            rt.ExplicitTimeout = true;
          } else if (key == "COST"_s) {
            rt.Cost = static_cast<float>(atof(val.c_str()));
          } else if (key == "REQUIRED_FILES"_s) {
            cmExpandList(val, rt.RequiredFiles);
          } else if (key == "RUN_SERIAL"_s) {
            rt.RunSerial = cmIsOn(val);
          } else if (key == "FAIL_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.ErrorRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "SKIP_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.SkipRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "PROCESSORS"_s) {
            rt.Processors = atoi(val.c_str());
            if (rt.Processors < 1) {
              rt.Processors = 1;
            }
          } else if (key == "PROCESSOR_AFFINITY"_s) {
            rt.WantAffinity = cmIsOn(val);
          } else if (key == "RESOURCE_GROUPS"_s) {
            if (!ParseResourceGroupsProperty(val, rt.ResourceGroups)) {
              return false;
            }
          } else if (key == "SKIP_RETURN_CODE"_s) {
            rt.SkipReturnCode = atoi(val.c_str());
            if (rt.SkipReturnCode < 0 || rt.SkipReturnCode > 255) {
              rt.SkipReturnCode = -1;
            }
          } else if (key == "DEPENDS"_s) {
            cmExpandList(val, rt.Depends);
          } else if (key == "ENVIRONMENT"_s) {
            cmExpandList(val, rt.Environment);
          } else if (key == "ENVIRONMENT_MODIFICATION"_s) {
            cmExpandList(val, rt.EnvironmentModification);
          } else if (key == "LABELS"_s) {
            std::vector<std::string> Labels = cmExpandedList(val);
            rt.Labels.insert(rt.Labels.end(), Labels.begin(), Labels.end());
            // sort the array
            std::sort(rt.Labels.begin(), rt.Labels.end());
            // remove duplicates
            auto new_end = std::unique(rt.Labels.begin(), rt.Labels.end());
            rt.Labels.erase(new_end, rt.Labels.end());
          } else if (key == "MEASUREMENT"_s) {
            size_t pos = val.find_first_of('=');
            if (pos != std::string::npos) {
              std::string mKey = val.substr(0, pos);
              std::string mVal = val.substr(pos + 1);
              rt.Measurements[mKey] = std::move(mVal);
            } else {
              rt.Measurements[val] = "1";
            }
          } else if (key == "PASS_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.RequiredRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "WORKING_DIRECTORY"_s) {
            rt.Directory = val;
          } else if (key == "TIMEOUT_AFTER_MATCH"_s) {
            std::vector<std::string> propArgs = cmExpandedList(val);
            if (propArgs.size() != 2) {
              cmCTestLog(this->CTest, WARNING,
                         "TIMEOUT_AFTER_MATCH expects two arguments, found "
                           << propArgs.size() << std::endl);
            } else {
              rt.AlternateTimeout = cmDuration(atof(propArgs[0].c_str()));
              std::vector<std::string> lval = cmExpandedList(propArgs[1]);
              for (std::string const& cr : lval) {
                rt.TimeoutRegularExpressions.emplace_back(cr, cr);
              }
            }
          }
        }
      }
    }
  }
  return true;
}